

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

void Curl_mime_unpause(curl_mimepart *part)

{
  curl_mimepart *local_20;
  curl_mimepart *subpart;
  curl_mime *mime;
  curl_mimepart *part_local;
  
  if (part != (curl_mimepart *)0x0) {
    if (part->lastreadstatus == 0x10000001) {
      part->lastreadstatus = 1;
    }
    if ((part->kind == MIMEKIND_MULTIPART) && (part->arg != (void *)0x0)) {
      for (local_20 = *(curl_mimepart **)((long)part->arg + 8); local_20 != (curl_mimepart *)0x0;
          local_20 = local_20->nextpart) {
        Curl_mime_unpause(local_20);
      }
    }
  }
  return;
}

Assistant:

void Curl_mime_unpause(curl_mimepart *part)
{
  if(part) {
    if(part->lastreadstatus == CURL_READFUNC_PAUSE)
      part->lastreadstatus = 1; /* Successful read status. */
    if(part->kind == MIMEKIND_MULTIPART) {
      curl_mime *mime = (curl_mime *) part->arg;

      if(mime) {
        curl_mimepart *subpart;

        for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart)
          Curl_mime_unpause(subpart);
      }
    }
  }
}